

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O3

void slang::ast::builtins::registerQueryFuncs(Compilation *c)

{
  tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_> tVar1;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_78;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_70;
  _Head_base<0UL,_slang::ast::SystemSubroutine_*,_false> local_68;
  __uniq_ptr_impl<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_60;
  __uniq_ptr_impl<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_58;
  __uniq_ptr_impl<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_50;
  __uniq_ptr_impl<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_48;
  __uniq_ptr_impl<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_40;
  __uniq_ptr_impl<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_38;
  __uniq_ptr_impl<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_30;
  __uniq_ptr_impl<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_28;
  __uniq_ptr_impl<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
  local_20;
  
  tVar1.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )operator_new(0x38);
  BitsFunction::BitsFunction
            ((BitsFunction *)
             tVar1.
             super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
             .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       tVar1.
       super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_20);
  if ((_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       )local_20._M_t.
        super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl !=
      (SystemSubroutine *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
                          .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl
                + 8))();
  }
  local_20._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )0x0;
  tVar1.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )operator_new(0x38);
  TypenameFunction::TypenameFunction
            ((TypenameFunction *)
             tVar1.
             super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
             .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl);
  local_28._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       tVar1.
       super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_28);
  if ((_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl !=
      (SystemSubroutine *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
                          .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl
                + 8))();
  }
  local_28._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )0x0;
  tVar1.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )operator_new(0x38);
  IsUnboundedFunction::IsUnboundedFunction
            ((IsUnboundedFunction *)
             tVar1.
             super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
             .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl);
  local_30._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       tVar1.
       super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_30);
  if ((_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       )local_30._M_t.
        super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl !=
      (SystemSubroutine *)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
                          .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl
                + 8))();
  }
  local_30._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )0x0;
  tVar1.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )operator_new(0x38);
  LowFunction::LowFunction
            ((LowFunction *)
             tVar1.
             super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
             .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl);
  local_38._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       tVar1.
       super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_38);
  if ((_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       )local_38._M_t.
        super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl !=
      (SystemSubroutine *)0x0) {
    (**(code **)(*(long *)local_38._M_t.
                          super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
                          .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl
                + 8))();
  }
  local_38._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )0x0;
  tVar1.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )operator_new(0x38);
  HighFunction::HighFunction
            ((HighFunction *)
             tVar1.
             super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
             .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl);
  local_40._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       tVar1.
       super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_40);
  if ((_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       )local_40._M_t.
        super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl !=
      (SystemSubroutine *)0x0) {
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
                          .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl
                + 8))();
  }
  local_40._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )0x0;
  tVar1.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )operator_new(0x38);
  LeftFunction::LeftFunction
            ((LeftFunction *)
             tVar1.
             super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
             .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl);
  local_48._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       tVar1.
       super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_48);
  if ((_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       )local_48._M_t.
        super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl !=
      (SystemSubroutine *)0x0) {
    (**(code **)(*(long *)local_48._M_t.
                          super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
                          .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl
                + 8))();
  }
  local_48._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )0x0;
  tVar1.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )operator_new(0x38);
  RightFunction::RightFunction
            ((RightFunction *)
             tVar1.
             super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
             .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl);
  local_50._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       tVar1.
       super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_50);
  if ((_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       )local_50._M_t.
        super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl !=
      (SystemSubroutine *)0x0) {
    (**(code **)(*(long *)local_50._M_t.
                          super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
                          .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl
                + 8))();
  }
  local_50._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )0x0;
  tVar1.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )operator_new(0x38);
  SizeFunction::SizeFunction
            ((SizeFunction *)
             tVar1.
             super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
             .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl);
  local_58._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       tVar1.
       super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_58);
  if ((_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       )local_58._M_t.
        super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl !=
      (SystemSubroutine *)0x0) {
    (**(code **)(*(long *)local_58._M_t.
                          super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
                          .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl
                + 8))();
  }
  local_58._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )0x0;
  tVar1.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )operator_new(0x38);
  IncrementFunction::IncrementFunction
            ((IncrementFunction *)
             tVar1.
             super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
             .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl);
  local_60._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       tVar1.
       super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_60);
  if ((_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
       )local_60._M_t.
        super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl !=
      (SystemSubroutine *)0x0) {
    (**(code **)(*(long *)local_60._M_t.
                          super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
                          .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl
                + 8))();
  }
  local_60._M_t.
  super__Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
  .super__Head_base<0UL,_slang::ast::SystemSubroutine_*,_false>._M_head_impl =
       (tuple<slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>)
       (_Tuple_impl<0UL,_slang::ast::SystemSubroutine_*,_std::default_delete<slang::ast::SystemSubroutine>_>
        )0x0;
  std::make_unique<slang::ast::builtins::ArrayDimensionFunction,char_const(&)[12],bool>
            ((char (*) [12])&local_78,(bool *)"$dimensions");
  local_68._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_68);
  if (local_68._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_68._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_68._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  std::make_unique<slang::ast::builtins::ArrayDimensionFunction,char_const(&)[21],bool>
            ((char (*) [21])&local_78,(bool *)"$unpacked_dimensions");
  local_70._M_head_impl = local_78._M_head_impl;
  local_78._M_head_impl = (SystemSubroutine *)0x0;
  Compilation::addSystemSubroutine
            (c,(unique_ptr<slang::ast::SystemSubroutine,_std::default_delete<slang::ast::SystemSubroutine>_>
                *)&local_70);
  if (local_70._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_70._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  local_70._M_head_impl = (SystemSubroutine *)0x0;
  if (local_78._M_head_impl != (SystemSubroutine *)0x0) {
    (*(local_78._M_head_impl)->_vptr_SystemSubroutine[1])();
  }
  return;
}

Assistant:

void registerQueryFuncs(Compilation& c) {
#define REGISTER(name) c.addSystemSubroutine(std::make_unique<name##Function>())
    REGISTER(Bits);
    REGISTER(Typename);
    REGISTER(IsUnbounded);
    REGISTER(Low);
    REGISTER(High);
    REGISTER(Left);
    REGISTER(Right);
    REGISTER(Size);
    REGISTER(Increment);
#undef REGISTER

    c.addSystemSubroutine(std::make_unique<ArrayDimensionFunction>("$dimensions", false));
    c.addSystemSubroutine(std::make_unique<ArrayDimensionFunction>("$unpacked_dimensions", true));
}